

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
_set_noalias<Eigen::CwiseNullaryOp<CppMLNN::init_model(unsigned_long)::__0,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_jin_qin[P]cppcnn_src_cppcnn_cppmlnn_cppmlnn_cpp:242:74),_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
          *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_jin_qin[P]cppcnn_src_cppcnn_cppmlnn_cppmlnn_cpp:242:74),_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *src;
  assign_op<double,_double> local_19;
  EigenBase<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_jin_qin[P]cppcnn_src_cppcnn_cppmlnn_cppmlnn_cpp:242:74),_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *local_18;
  DenseBase<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_jin_qin[P]cppcnn_src_cppcnn_cppmlnn_cppmlnn_cpp:242:74),_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *other_local;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  local_18 = (EigenBase<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_jin_qin[P]cppcnn_src_cppcnn_cppmlnn_cppmlnn_cpp:242:74),_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)other;
  other_local = (DenseBase<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_jin_qin[P]cppcnn_src_cppcnn_cppmlnn_cppmlnn_cpp:242:74),_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)this;
  pMVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  src = EigenBase<Eigen::CwiseNullaryOp<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/cppmlnn/cppmlnn.cpp:242:74),_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::derived(local_18);
  internal::assign_op<double,_double>::assign_op(&local_19);
  internal::
  call_assignment_no_alias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<CppMLNN::init_model(unsigned_long)::__0,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
            (pMVar1,src,&local_19);
  pMVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC 
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }